

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::parseString(Parser *this)

{
  ValueLength VVar1;
  bool bVar2;
  ExceptionType EVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *msg;
  Parser *in_RDI;
  int j_1;
  int follow;
  int j;
  uint32_t v;
  ValueLength i_1;
  ValueLength len_1;
  ValueLength len;
  int i;
  size_t count;
  size_t remainder;
  uint32_t highSurrogate;
  bool large;
  ValueLength base;
  undefined4 in_stack_ffffffffffffff18;
  ExceptionType in_stack_ffffffffffffff1c;
  uint8_t uVar8;
  Builder *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  ExceptionType in_stack_ffffffffffffff2c;
  Builder *in_stack_ffffffffffffff30;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  ulong local_50;
  ulong local_48;
  long local_30;
  uint local_20;
  
  VVar1 = in_RDI->_builderPtr->_pos;
  Builder::appendByte(in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
  bVar2 = false;
  local_20 = 0;
LAB_001270a0:
  do {
    uVar6 = in_RDI->_size - in_RDI->_pos;
    if (0xf < uVar6) {
      Builder::reserve(in_stack_ffffffffffffff30,
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if ((in_RDI->options->validateUtf8Strings & 1U) == 0) {
        local_30 = (*(code *)JSONStringCopy)
                             (in_RDI->_builderPtr->_start + in_RDI->_builderPtr->_pos,
                              in_RDI->_start + in_RDI->_pos,uVar6 - 0xf);
      }
      else {
        local_30 = (*(code *)JSONStringCopyCheckUtf8)
                             (in_RDI->_builderPtr->_start + in_RDI->_builderPtr->_pos,
                              in_RDI->_start + in_RDI->_pos,uVar6 - 0xf);
      }
      in_RDI->_pos = local_30 + in_RDI->_pos;
      Builder::advance(in_stack_ffffffffffffff20,
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    uVar4 = getOneOrThrow((Parser *)in_stack_ffffffffffffff30,
                          (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if ((!bVar2) && (0x7e < in_RDI->_builderPtr->_pos - (VVar1 + 1))) {
      bVar2 = true;
      Builder::reserve(in_stack_ffffffffffffff30,
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      memmove(in_RDI->_builderPtr->_start + VVar1 + 9,in_RDI->_builderPtr->_start + VVar1 + 1,
              in_RDI->_builderPtr->_pos - (VVar1 + 1));
      Builder::advance(in_stack_ffffffffffffff20,
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    if (uVar4 == 0x22) {
      if (bVar2) {
        local_48 = in_RDI->_builderPtr->_pos - (VVar1 + 9);
        in_RDI->_builderPtr->_start[VVar1] = 0xbf;
        for (local_50 = 1; local_50 < 9; local_50 = local_50 + 1) {
          in_RDI->_builderPtr->_start[VVar1 + local_50] = (uint8_t)local_48;
          local_48 = local_48 >> 8;
        }
      }
      else {
        in_RDI->_builderPtr->_start[VVar1] =
             ((char)in_RDI->_builderPtr->_pos - ((char)VVar1 + '\x01')) + '@';
      }
      if ((in_RDI->options->validateUtf8Strings & 1U) == 0 || local_20 == 0) {
        return;
      }
      uVar7 = __cxa_allocate_exception(0x18);
      Exception::Exception
                ((Exception *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 (char *)in_stack_ffffffffffffff20);
      __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
    }
    if (uVar4 == 0x5c) {
      iVar5 = consume(in_RDI);
      if (iVar5 < 0) {
        uVar7 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                   (char *)in_stack_ffffffffffffff20);
        __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
      }
      uVar8 = (uint8_t)(in_stack_ffffffffffffff1c >> 0x18);
      switch(iVar5) {
      case 0x22:
      case 0x2f:
      case 0x5c:
        Builder::appendByte(in_stack_ffffffffffffff20,uVar8);
        break;
      default:
        uVar7 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                   (char *)in_stack_ffffffffffffff20);
        __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
      case 0x62:
        Builder::appendByte(in_stack_ffffffffffffff20,uVar8);
        break;
      case 0x66:
        Builder::appendByte(in_stack_ffffffffffffff20,uVar8);
        break;
      case 0x6e:
        Builder::appendByte(in_stack_ffffffffffffff20,uVar8);
        break;
      case 0x72:
        Builder::appendByte(in_stack_ffffffffffffff20,uVar8);
        break;
      case 0x74:
        Builder::appendByte(in_stack_ffffffffffffff20,uVar8);
        break;
      case 0x75:
        local_54 = 0;
        for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
          iVar5 = consume(in_RDI);
          if (iVar5 < 0) {
            uVar7 = __cxa_allocate_exception(0x18);
            Exception::Exception
                      ((Exception *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                       (char *)in_stack_ffffffffffffff20);
            __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
          }
          if ((iVar5 < 0x30) || (0x39 < iVar5)) {
            if ((iVar5 < 0x61) || (0x66 < iVar5)) {
              if ((iVar5 < 0x41) || (0x46 < iVar5)) {
                uVar7 = __cxa_allocate_exception(0x18);
                Exception::Exception
                          ((Exception *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                           (char *)in_stack_ffffffffffffff20);
                __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
              }
              local_54 = (local_54 * 0x10 + iVar5) - 0x37;
            }
            else {
              local_54 = (local_54 * 0x10 + iVar5) - 0x57;
            }
          }
          else {
            local_54 = (local_54 * 0x10 + iVar5) - 0x30;
          }
        }
        if (local_54 < 0x80) {
          Builder::appendByte(in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18)
                             );
        }
        else if (local_54 < 0x800) {
          Builder::reserve(in_stack_ffffffffffffff30,
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          Builder::appendByteUnchecked
                    (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
          Builder::appendByteUnchecked
                    (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
        }
        else if ((local_54 < 0xdc00) || (0xdfff < local_54)) {
          if ((local_54 < 0xd800) || (0xdbff < local_54)) {
            Builder::reserve(in_stack_ffffffffffffff30,
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
            Builder::appendByteUnchecked
                      (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
            Builder::appendByteUnchecked
                      (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
            Builder::appendByteUnchecked
                      (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
          }
          else {
            if (local_20 == 0) {
              local_20 = local_54;
              Builder::reserve(in_stack_ffffffffffffff30,
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
              Builder::appendByteUnchecked
                        (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
              Builder::appendByteUnchecked
                        (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
              Builder::appendByteUnchecked
                        (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
              goto LAB_001270a0;
            }
            if ((in_RDI->options->validateUtf8Strings & 1U) != 0) {
              uVar7 = __cxa_allocate_exception(0x18);
              Exception::Exception
                        ((Exception *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                         (char *)in_stack_ffffffffffffff20);
              __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
            }
          }
        }
        else if (local_20 == 0) {
          if ((in_RDI->options->validateUtf8Strings & 1U) != 0) {
            uVar7 = __cxa_allocate_exception(0x18);
            Exception::Exception
                      ((Exception *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                       (char *)in_stack_ffffffffffffff20);
            __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
          }
        }
        else {
          Builder::rollback(in_stack_ffffffffffffff20,
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          Builder::reserve(in_stack_ffffffffffffff30,
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          Builder::appendByteUnchecked
                    (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
          Builder::appendByteUnchecked
                    (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
          Builder::appendByteUnchecked
                    (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
          Builder::appendByteUnchecked
                    (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
          local_20 = 0;
        }
      }
    }
    else {
      uVar8 = (uint8_t)(in_stack_ffffffffffffff1c >> 0x18);
      if ((uVar4 & 0x80) == 0) {
        if ((int)uVar4 < 0x20) {
          uVar7 = __cxa_allocate_exception(0x18);
          Exception::Exception((Exception *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
        }
        Builder::appendByte(in_stack_ffffffffffffff20,uVar8);
      }
      else if ((in_RDI->options->validateUtf8Strings & 1U) == 0) {
        Builder::appendByte(in_stack_ffffffffffffff20,uVar8);
      }
      else {
        if ((uVar4 & 0xe0) == 0x80) {
          uVar7 = __cxa_allocate_exception(0x18);
          Exception::Exception((Exception *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
        }
        if ((uVar4 & 0xe0) == 0xc0) {
          local_5c = 1;
        }
        else if ((uVar4 & 0xf0) == 0xe0) {
          local_5c = 2;
        }
        else {
          if ((uVar4 & 0xf8) != 0xf0) {
            uVar7 = __cxa_allocate_exception(0x18);
            Exception::Exception((Exception *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
            __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
          }
          local_5c = 3;
        }
        Builder::reserve(in_stack_ffffffffffffff30,
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        Builder::appendByteUnchecked
                  (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
        for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
          uVar4 = getOneOrThrow((Parser *)in_stack_ffffffffffffff30,
                                (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                ));
          if ((uVar4 & 0xc0) != 0x80) {
            uVar7 = __cxa_allocate_exception(0x18);
            Exception::Exception((Exception *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
            __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
          }
          Builder::appendByteUnchecked
                    (in_stack_ffffffffffffff20,(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
        }
      }
    }
    EVar3 = in_stack_ffffffffffffff2c & 0xffffff;
    if ((in_RDI->options->validateUtf8Strings & 1U) != 0) {
      EVar3 = CONCAT13(local_20 != 0,(int3)in_stack_ffffffffffffff2c);
    }
    in_stack_ffffffffffffff2c = EVar3;
    if ((char)(in_stack_ffffffffffffff2c >> 0x18) != '\0') {
      msg = (char *)__cxa_allocate_exception(0x18);
      Exception::Exception((Exception *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,msg);
      __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
    }
  } while( true );
}

Assistant:

void Parser::parseString() {
  // When we get here, we have seen a " character and now want to
  // find the end of the string and parse the string value to its
  // VPack representation. We assume that the string is short and
  // insert 8 bytes for the length as soon as we reach 127 bytes
  // in the VPack representation.
  ValueLength const base = _builderPtr->_pos;
  _builderPtr->appendByte(0x40);  // correct this later

  bool large = false;          // set to true when we reach 128 bytes
  uint32_t highSurrogate = 0;  // non-zero if high-surrogate was seen

  while (true) {
    std::size_t remainder = _size - _pos;
    if (remainder >= 16) {
      _builderPtr->reserve(remainder);
      std::size_t count;
      // Note that the SSE4.2 accelerated string copying functions might
      // peek up to 15 bytes over the given end, because they use 128bit
      // registers. Therefore, we have to subtract 15 from remainder
      // to be on the safe side. Further bytes will be processed below.
      if (options->validateUtf8Strings) {
        count = JSONStringCopyCheckUtf8(_builderPtr->_start + _builderPtr->_pos,
                                        _start + _pos, remainder - 15);
      } else {
        count = JSONStringCopy(_builderPtr->_start + _builderPtr->_pos,
                               _start + _pos, remainder - 15);
      }
      _pos += count;
      _builderPtr->advance(count);
    }
    int i = getOneOrThrow("Unfinished string");
    if (!large && _builderPtr->_pos - (base + 1) > 126) {
      large = true;
      _builderPtr->reserve(8);
      ValueLength len = _builderPtr->_pos - (base + 1);
      memmove(_builderPtr->_start + base + 9, _builderPtr->_start + base + 1,
              checkOverflow(len));
      _builderPtr->advance(8);
    }
    
    switch (i) {
      case '"':
        ValueLength len;
        if (!large) {
          len = _builderPtr->_pos - (base + 1);
          _builderPtr->_start[base] = 0x40 + static_cast<uint8_t>(len);
          // String is ready
        } else {
          len = _builderPtr->_pos - (base + 9);
          _builderPtr->_start[base] = 0xbf;
          for (ValueLength i = 1; i <= 8; i++) {
            _builderPtr->_start[base + i] = len & 0xff;
            len >>= 8;
          }
        }
        if (VELOCYPACK_UNLIKELY(options->validateUtf8Strings && highSurrogate != 0)) {
          throw Exception(Exception::InvalidUtf8Sequence,
                              "Unexpected end of string after high surrogate");
        }
        return;
      case '\\':
        // Handle cases or throw error
        i = consume();
        if (VELOCYPACK_UNLIKELY(i < 0)) {
          throw Exception(Exception::ParseError, "Invalid escape sequence");
        }
        switch (i) {
          case '"':
          case '/':
          case '\\':
            _builderPtr->appendByte(static_cast<uint8_t>(i));
            break;
          case 'b':
            _builderPtr->appendByte('\b');
            break;
          case 'f':
            _builderPtr->appendByte('\f');
            break;
          case 'n':
            _builderPtr->appendByte('\n');
            break;
          case 'r':
            _builderPtr->appendByte('\r');
            break;
          case 't':
            _builderPtr->appendByte('\t');
            break;
          case 'u': {
            uint32_t v = 0;
            for (int j = 0; j < 4; j++) {
              i = consume();
              if (i < 0) {
                throw Exception(Exception::ParseError,
                                "Unfinished \\uXXXX escape sequence");
              }
              if (i >= '0' && i <= '9') {
                v = (v << 4) + i - '0';
              } else if (i >= 'a' && i <= 'f') {
                v = (v << 4) + i - 'a' + 10;
              } else if (i >= 'A' && i <= 'F') {
                v = (v << 4) + i - 'A' + 10;
              } else {
                throw Exception(Exception::ParseError,
                                "Illegal \\uXXXX escape sequence character");
              }
            }
            if (v < 0x80) {
              _builderPtr->appendByte(static_cast<uint8_t>(v));
            } else if (v < 0x800) {
              _builderPtr->reserve(2);
              _builderPtr->appendByteUnchecked(0xc0 + (v >> 6));
              _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
            } else if (v >= 0xdc00 && v < 0xe000) {
              if (highSurrogate != 0) {
                // Low surrogate, put the two together:
                v = 0x10000 + ((highSurrogate - 0xd800) << 10) + v - 0xdc00;
                _builderPtr->rollback(3);
                _builderPtr->reserve(4);
                _builderPtr->appendByteUnchecked(0xf0 + (v >> 18));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 12) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
                highSurrogate = 0;
              } else if (options->validateUtf8Strings) {
                // Low surrogate without a high surrogate first
                throw Exception(Exception::InvalidUtf8Sequence,
                                "Unexpected \\uXXXX escape sequence (low surrogate without high surrogate)");
              }
            } else if (v >= 0xd800 && v < 0xdc00) {
              if (highSurrogate == 0) {
                // High surrogate:
                highSurrogate = v;
                _builderPtr->reserve(3);
                _builderPtr->appendByteUnchecked(0xe0 + (v >> 12));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));

                continue;
              } else if (options->validateUtf8Strings) {
                throw Exception(Exception::InvalidUtf8Sequence,
                                "Unexpected \\uXXXX escape sequence (multiple adjacent high surrogates)");
              }
            } else {
              _builderPtr->reserve(3);
              _builderPtr->appendByteUnchecked(0xe0 + (v >> 12));
              _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
              _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
            }
            break;
          }
          default:
            throw Exception(Exception::ParseError, "Invalid escape sequence");
        }
        break;
      default:
        if ((i & 0x80) == 0) {
          // non-UTF-8 sequence
          if (VELOCYPACK_UNLIKELY(i < 0x20)) {
            // control character
            throw Exception(Exception::UnexpectedControlCharacter);
          }
          _builderPtr->appendByte(static_cast<uint8_t>(i));
        } else {
          if (!options->validateUtf8Strings) {
            _builderPtr->appendByte(static_cast<uint8_t>(i));
          } else {
            // multi-byte UTF-8 sequence!
            int follow = 0;
            if ((i & 0xe0) == 0x80) {
              throw Exception(Exception::InvalidUtf8Sequence);
            } else if ((i & 0xe0) == 0xc0) {
              // two-byte sequence
              follow = 1;
            } else if ((i & 0xf0) == 0xe0) {
              // three-byte sequence
              follow = 2;
            } else if ((i & 0xf8) == 0xf0) {
              // four-byte sequence
              follow = 3;
            } else {
              throw Exception(Exception::InvalidUtf8Sequence);
            }

            // validate follow up characters
            _builderPtr->reserve(1 + follow);
            _builderPtr->appendByteUnchecked(static_cast<uint8_t>(i));
            for (int j = 0; j < follow; ++j) {
              i = getOneOrThrow("scanString: truncated UTF-8 sequence");
              if ((i & 0xc0) != 0x80) {
                throw Exception(Exception::InvalidUtf8Sequence);
              }
              _builderPtr->appendByteUnchecked(static_cast<uint8_t>(i));
            }
          }
        }
        break;
    }

    if (VELOCYPACK_UNLIKELY(options->validateUtf8Strings && highSurrogate != 0)) {
      throw Exception(Exception::InvalidUtf8Sequence,
                      "Unexpected \\uXXXX escape sequence (high surrogate without low surrogate)");
    }
  }
}